

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O0

void __thiscall TempSpace::TempSpace(TempSpace *this,uchar **strs,size_t n)

{
  uint uVar1;
  ostream *poVar2;
  uint diff_1;
  uint diff;
  size_t rawbytes;
  char *raw;
  size_t n_local;
  uchar **strs_local;
  TempSpace *this_local;
  
  this->strings = (cacheblock_t *)0x0;
  this->allocated = (cacheblock_t *)0x0;
  this->elements_in_strings = 0;
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"TempSpace::TempSpace(unsigned char **, size_t)");
  std::operator<<(poVar2,"\n");
  _diff_1 = n * 8;
  rawbytes = (size_t)strs;
  if (((ulong)strs & 0xf) != 0) {
    uVar1 = (uint)strs & 0xf;
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"\t: alignment mismatch by ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::operator<<(poVar2,"bytes\n");
    rawbytes = (long)strs + (ulong)uVar1;
    _diff_1 = _diff_1 - uVar1;
  }
  if ((_diff_1 & 0xf) != 0) {
    uVar1 = (uint)_diff_1 & 0xf;
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"\t: truncate by ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::operator<<(poVar2,"bytes\n");
    _diff_1 = _diff_1 - uVar1;
  }
  this->strings = (cacheblock_t *)rawbytes;
  this->elements_in_strings = _diff_1 >> 4;
  return;
}

Assistant:

TempSpace(unsigned char** strs, size_t n)
		: strings(0), allocated(0), elements_in_strings(0)
	{
		debug()<<__PRETTY_FUNCTION__<<"\n";
		char* raw = reinterpret_cast<char*>(strs);
		size_t rawbytes = n*sizeof(unsigned char*);
		if (std::ptrdiff_t(raw) % sizeof(cacheblock_t)) {
			unsigned diff = std::ptrdiff_t(raw) % sizeof(cacheblock_t);
			debug()<<"\t: alignment mismatch by "<<diff<<"bytes\n";
			raw      += diff;
			rawbytes -= diff;
		}
		if (rawbytes % sizeof(cacheblock_t)) {
			unsigned diff = rawbytes % sizeof(cacheblock_t);
			debug()<<"\t: truncate by "<<diff<<"bytes\n";
			rawbytes -= diff;
		}
		strings = reinterpret_cast<cacheblock_t*>(raw);
		elements_in_strings = rawbytes / sizeof(cacheblock_t);
	}